

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

lostFraction __thiscall llvm::detail::IEEEFloat::shiftSignificandRight(IEEEFloat *this,uint bits)

{
  uint parts;
  lostFraction lVar1;
  integerPart *dst;
  uint bits_local;
  IEEEFloat *this_local;
  
  if (this->exponent <= (short)(this->exponent + (short)bits)) {
    this->exponent = this->exponent + (short)bits;
    dst = significandParts(this);
    parts = partCount(this);
    lVar1 = shiftRight(dst,parts,bits);
    return lVar1;
  }
  __assert_fail("(ExponentType) (exponent + bits) >= exponent",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x48f,"lostFraction llvm::detail::IEEEFloat::shiftSignificandRight(unsigned int)");
}

Assistant:

lostFraction IEEEFloat::shiftSignificandRight(unsigned int bits) {
  /* Our exponent should not overflow.  */
  assert((ExponentType) (exponent + bits) >= exponent);

  exponent += bits;

  return shiftRight(significandParts(), partCount(), bits);
}